

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall
despot::TagHistoryModePolicy::TagHistoryModePolicy
          (TagHistoryModePolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  Floor *this_00;
  int **ppiVar1;
  int iVar2;
  BaseTag *pBVar3;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagHistoryModePolicy_0011f8d8;
  pBVar3 = (BaseTag *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    pBVar3 = (BaseTag *)0x0;
  }
  this->tag_model_ = pBVar3;
  this_00 = &this->floor_;
  despot::Floor::Floor(this_00);
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->paths_).
  super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar3 = this->tag_model_;
  iVar2 = (pBVar3->floor_).num_cols_;
  ppiVar1 = (pBVar3->floor_).floor_;
  this_00->num_rows_ = (pBVar3->floor_).num_rows_;
  this_00->num_cols_ = iVar2;
  (this->floor_).floor_ = ppiVar1;
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator=
            (&(this->floor_).cells_,&(pBVar3->floor_).cells_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->floor_).dist_,&(pBVar3->floor_).dist_);
  iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->state_probs_,(long)iVar2);
  iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
  std::
  vector<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&this->paths_,(long)iVar2);
  this->belief_ = (Belief *)0x0;
  return;
}

Assistant:

TagHistoryModePolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
	DefaultPolicy(model, bound),
	tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
		state_probs_.resize(tag_model_->NumStates());
		paths_.resize(tag_model_->NumActions());
		belief_ = NULL;
	}